

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O3

ON_Plane * __thiscall
ON_SubDVertex::VertexFrame
          (ON_Plane *__return_storage_ptr__,ON_SubDVertex *this,
          ON_SubDComponentLocation subd_appearance)

{
  ON_3dVector *v;
  double d;
  bool bVar1;
  uint uVar2;
  ON_SubDFace *sector_face;
  ON_SubDEdge *this_00;
  ON_SubDVertex *this_01;
  ON_SubDFace *this_02;
  long lVar3;
  ON_Plane *pOVar4;
  ON_Plane *pOVar5;
  byte bVar6;
  ON_3dVector X;
  ON_Plane vertex_frame;
  ON_3dVector V;
  ON_3dVector local_180;
  ON_3dPoint local_168;
  ON_3dVector local_150;
  ON_Plane local_138;
  ON_SubDSectorSurfacePoint local_b8;
  ON_3dPoint local_48;
  
  bVar6 = 0;
  uVar2 = FaceCount(this);
  if ((uVar2 == 0) || (sector_face = Face(this,0), sector_face == (ON_SubDFace *)0x0)) {
    pOVar4 = &ON_Plane::NanPlane;
    pOVar5 = __return_storage_ptr__;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pOVar5->origin).x = (pOVar4->origin).x;
      pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    return __return_storage_ptr__;
  }
  pOVar4 = &ON_Plane::NanPlane;
  pOVar5 = &local_138;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar5->origin).x = (pOVar4->origin).x;
    pOVar4 = (ON_Plane *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pOVar5 = (ON_Plane *)((long)pOVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  pOVar4 = __return_storage_ptr__;
  if (subd_appearance == ControlNet) {
    local_b8.m_limitP[2] = ON_3dVector::ZeroVector.z;
    local_b8.m_limitP[0] = ON_3dVector::ZeroVector.x;
    local_b8.m_limitP[1] = ON_3dVector::ZeroVector.y;
    this_02 = sector_face;
    if (this->m_edge_count != 0) {
      uVar2 = 0;
      do {
        this_00 = Edge(this,uVar2);
        if ((((this_00 != (ON_SubDEdge *)0x0) &&
             (this_01 = ON_SubDEdge::OtherEndVertex(this_00,this), this_01 != (ON_SubDVertex *)0x0))
            && (this_00->m_face_count == 1)) &&
           (this_02 = ON_SubDEdge::Face(this_00,0), this_02 != (ON_SubDFace *)0x0)) {
          ControlNetPoint((ON_3dPoint *)&local_150,this_01);
          ControlNetPoint(&local_48,this);
          ON_3dPoint::operator-(&local_180,(ON_3dPoint *)&local_150,&local_48);
          ON_3dVector::UnitVector((ON_3dVector *)&local_168,&local_180);
          local_b8.m_limitP[2] = local_168.z;
          local_b8.m_limitP[0] = local_168.x;
          local_b8.m_limitP[1] = local_168.y;
          break;
        }
        uVar2 = uVar2 + 1;
        this_02 = sector_face;
      } while (uVar2 < this->m_edge_count);
    }
    ControlNetPoint(&local_168,this);
    ON_SubDFace::ControlNetCenterNormal(&local_180,this_02);
    ON_Plane::CreateFromNormal(&local_138,&local_168,&local_180);
    v = &local_138.zaxis;
    d = ON_3dVector::operator*((ON_3dVector *)&local_b8,v);
    ::operator*(&local_150,d,v);
    ON_3dVector::operator-(&local_180,(ON_3dVector *)&local_b8,&local_150);
    ON_3dVector::UnitVector((ON_3dVector *)&local_168,&local_180);
    bVar1 = ON_3dVector::IsUnitVector((ON_3dVector *)&local_168);
    if (bVar1) {
      local_138.xaxis.z = local_168.z;
      local_138.xaxis.x = local_168.x;
      local_138.xaxis.y = local_168.y;
      ON_CrossProduct(&local_150,v,&local_138.xaxis);
      ON_3dVector::UnitVector(&local_180,&local_150);
      local_138.yaxis.z = local_180.z;
      local_138.yaxis.x = local_180.x;
      local_138.yaxis.y = local_180.y;
    }
  }
  else {
    uVar2 = FaceCount(this);
    if ((uVar2 != 0) && (bVar1 = GetSurfacePoint(this,sector_face,false,&local_b8), !bVar1)) {
      pOVar5 = &ON_Plane::NanPlane;
      lVar3 = 0x10;
      goto LAB_00600e3e;
    }
    ON_CrossProduct((ON_3dVector *)&local_168,local_b8.m_limitN,local_b8.m_limitT1);
    ON_3dVector::Unitize((ON_3dVector *)&local_168);
    ON_3dPoint::ON_3dPoint((ON_3dPoint *)&local_180,local_b8.m_limitP);
    ON_3dVector::ON_3dVector(&local_150,local_b8.m_limitN);
    ON_Plane::CreateFromNormal(&local_138,(ON_3dPoint *)&local_180,&local_150);
    local_138.yaxis.x = local_168.x;
    local_138.yaxis.y = local_168.y;
    local_138.yaxis.z = local_168.z;
    ON_CrossProduct(&local_180,&local_138.yaxis,&local_138.zaxis);
    local_138.xaxis.z = local_180.z;
    local_138.xaxis.x = local_180.x;
    local_138.xaxis.y = local_180.y;
    ON_3dVector::Unitize(&local_138.xaxis);
  }
  pOVar5 = &local_138;
  bVar1 = ON_Plane::IsValid(pOVar5);
  if (!bVar1) {
    pOVar5 = &ON_Plane::NanPlane;
  }
  lVar3 = 0x10;
LAB_00600e3e:
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    (pOVar4->origin).x = (pOVar5->origin).x;
    pOVar5 = (ON_Plane *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
    pOVar4 = (ON_Plane *)((long)pOVar4 + (ulong)bVar6 * -0x10 + 8);
  }
  ON_Plane::~ON_Plane(&local_138);
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDVertex::VertexFrame(
  ON_SubDComponentLocation subd_appearance
) const
{
  if (0 == FaceCount())
    return ON_Plane::NanPlane;

  const ON_SubDFace* sector_face = Face(0);
  if (nullptr == sector_face)
    return ON_Plane::NanPlane;

  ON_Plane vertex_frame(ON_Plane::NanPlane);
  if (ON_SubDComponentLocation::ControlNet == subd_appearance)
  {
    ON_3dVector V = ON_3dVector::ZeroVector;
    for (int vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = Edge(vei);
      if (nullptr == e)
        continue;
      const ON_SubDVertex* v1 = e->OtherEndVertex(this);
      if (nullptr == v1)
        continue;
      const ON_SubDFace* f = (1 == e->m_face_count) ? e->Face(0) : nullptr;
      if (nullptr == f)
        continue;
      sector_face = f;
      V = (v1->ControlNetPoint() - ControlNetPoint()).UnitVector();
      break;
    }
    vertex_frame.CreateFromNormal(ControlNetPoint(), sector_face->ControlNetCenterNormal());
    const ON_3dVector X = (V - (V * vertex_frame.zaxis) * vertex_frame.zaxis).UnitVector();
    if (X.IsUnitVector())
    {
      vertex_frame.xaxis = X;
      vertex_frame.yaxis = ON_CrossProduct(vertex_frame.zaxis, vertex_frame.xaxis).UnitVector();
    }
  }
  else
  {
    // If this is a smooth vertex or a crease vertex on the boundary,
    // then the sector_face does not matter. Otherwise it picks the
    // "side of the crease" for the normal.
    ON_SubDSectorSurfacePoint limit_point;
    if (FaceCount())
      if (false == GetSurfacePoint(sector_face, limit_point))
        return ON_Plane::NanPlane;

    ON_3dVector Y(ON_CrossProduct(limit_point.m_limitN, limit_point.m_limitT1));
    Y.Unitize();

    // The normal is more important than the tangent direction. 
    vertex_frame.CreateFromNormal(ON_3dPoint(limit_point.m_limitP), ON_3dVector(limit_point.m_limitN));
    vertex_frame.yaxis = Y;
    vertex_frame.xaxis = ON_CrossProduct(vertex_frame.yaxis, vertex_frame.zaxis);
    vertex_frame.xaxis.Unitize();
  }

  return vertex_frame.IsValid() ? vertex_frame : ON_Plane::NanPlane;
}